

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

uint __thiscall ON_Mesh::AppendDuplicateVertex(ON_Mesh *this,uint vertex_index)

{
  ON_2dPoint *pOVar1;
  ON_SurfaceCurvature *pOVar2;
  uint uVar3;
  ON_3fPoint *pOVar4;
  ON_3dPoint *pOVar5;
  ON_3fVector *pOVar6;
  uint uVar7;
  ON_3fPoint V;
  undefined1 local_38 [8];
  double dStack_30;
  double local_28;
  
  uVar3 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  uVar7 = 0xffffffff;
  if (vertex_index < uVar3) {
    pOVar4 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
    dStack_30 = (double)CONCAT44(dStack_30._4_4_,pOVar4[vertex_index].z);
    pOVar4 = pOVar4 + vertex_index;
    local_38._0_4_ = pOVar4->x;
    local_38._4_4_ = pOVar4->y;
    ON_SimpleArray<ON_3fPoint>::Append
              (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,(ON_3fPoint *)local_38);
    if (uVar3 == (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count) {
      pOVar5 = (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a;
      local_28 = pOVar5[vertex_index].z;
      pOVar5 = pOVar5 + vertex_index;
      local_38 = (undefined1  [8])pOVar5->x;
      dStack_30 = pOVar5->y;
      ON_SimpleArray<ON_3dPoint>::Append
                (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,(ON_3dPoint *)local_38);
    }
    if (uVar3 == (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count) {
      pOVar6 = (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
      dStack_30 = (double)CONCAT44(dStack_30._4_4_,pOVar6[vertex_index].z);
      pOVar6 = pOVar6 + vertex_index;
      local_38._0_4_ = pOVar6->x;
      local_38._4_4_ = pOVar6->y;
      ON_SimpleArray<ON_3fVector>::Append
                (&(this->m_N).super_ON_SimpleArray<ON_3fVector>,(ON_3fVector *)local_38);
    }
    if (uVar3 == (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count) {
      local_38 = *(undefined1 (*) [8])
                  ((this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a + vertex_index);
      ON_SimpleArray<ON_2fPoint>::Append
                (&(this->m_T).super_ON_SimpleArray<ON_2fPoint>,(ON_2fPoint *)local_38);
    }
    if (uVar3 == (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count) {
      pOVar1 = (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a + vertex_index;
      local_38 = (undefined1  [8])pOVar1->x;
      dStack_30 = pOVar1->y;
      ON_SimpleArray<ON_2dPoint>::Append
                (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>,(ON_2dPoint *)local_38);
    }
    if (uVar3 == (this->m_K).m_count) {
      pOVar2 = (this->m_K).m_a + vertex_index;
      local_38 = (undefined1  [8])pOVar2->k1;
      dStack_30 = pOVar2->k2;
      ON_SimpleArray<ON_SurfaceCurvature>::Append(&this->m_K,(ON_SurfaceCurvature *)local_38);
    }
    if (uVar3 == (this->m_C).m_count) {
      local_38._0_4_ = (this->m_C).m_a[vertex_index].field_0.m_color;
      ON_SimpleArray<ON_Color>::Append(&this->m_C,(ON_Color *)local_38);
    }
    uVar7 = uVar3;
    if (uVar3 == (this->m_H).m_count) {
      local_38[0] = (this->m_H).m_a[vertex_index];
      ON_SimpleArray<bool>::Append(&this->m_H,(bool *)local_38);
    }
  }
  return uVar7;
}

Assistant:

bool
ON_MeshFace::IsValid(int mesh_vertex_count) const
{
  return (vi[0] >= 0 && vi[0] < mesh_vertex_count
    && vi[1] >= 0 && vi[1] < mesh_vertex_count
    && vi[2] >= 0 && vi[2] < mesh_vertex_count
    && vi[3] >= 0 && vi[3] < mesh_vertex_count
    && vi[0] != vi[1] && vi[1] != vi[2] && vi[2] != vi[0]
    && (vi[2] == vi[3] || (vi[0] != vi[3] && vi[1] != vi[3])));
}